

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeDisc.cpp
# Opt level: O0

void pzshape::TPZShapeDisc::LegendreWithoutScale
               (REAL C,REAL x0,REAL x,int degree,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi,
               int n)

{
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  int in_EDI;
  int in_stack_00000044;
  TPZFMatrix<double> *in_stack_00000048;
  TPZFMatrix<double> *in_stack_00000050;
  int in_stack_0000005c;
  REAL in_stack_00000060;
  
  (**(code **)(*in_RSI + 0x70))(in_RSI,(long)(in_EDI + 1),1);
  (**(code **)(*in_RDX + 0x70))(in_RDX,(long)in_ECX,(long)(in_EDI + 1));
  TPZShapeLinear::Legendre
            (in_stack_00000060,in_stack_0000005c,in_stack_00000050,in_stack_00000048,
             in_stack_00000044);
  return;
}

Assistant:

void TPZShapeDisc::LegendreWithoutScale(REAL C,REAL x0,REAL x,int degree,TPZFMatrix<REAL> & phi,TPZFMatrix<REAL> & dphi, int n){
#ifdef PZDEBUG
  if(IsZero(C)){
    DebugStop();
  }
#endif

   phi.Redim(degree+1,1);
   dphi.Redim(n,degree+1);

   TPZShapeLinear::Legendre(x, degree+1, phi, dphi, n);

}